

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall psy::C::Parser::parseExtGNU_Attribute(Parser *this,ExtGNU_AttributeSyntax **attr)

{
  initializer_list<psy::C::SyntaxKind> __l;
  SyntaxKind SVar1;
  int iVar2;
  uint uVar3;
  SyntaxToken *pSVar4;
  IndexType IVar5;
  ExtGNU_AttributeSyntax *pEVar6;
  char *__s1;
  bool local_b9;
  code *local_80;
  offset_in_Parser_to_subr parseAttrArg;
  Identifier *ident;
  allocator<psy::C::SyntaxKind> local_51;
  SyntaxKind local_50 [4];
  iterator local_48;
  size_type local_40;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_38;
  ExtGNU_AttributeSyntax **local_20;
  ExtGNU_AttributeSyntax **attr_local;
  Parser *this_local;
  
  local_20 = attr;
  attr_local = (ExtGNU_AttributeSyntax **)this;
  pSVar4 = peek(this,1);
  SVar1 = SyntaxToken::kind(pSVar4);
  if (SVar1 != IdentifierToken) {
    if (SVar1 == CloseParenToken) {
LAB_004077b1:
      pEVar6 = makeNode<psy::C::ExtGNU_AttributeSyntax>(this);
      *local_20 = pEVar6;
      return true;
    }
    if (SVar1 != KeywordAlias___const) {
      if (SVar1 != CommaToken) {
        local_50[0] = IdentifierToken;
        local_50[1] = 0x22;
        local_50[2] = 100;
        local_50[3] = 0x1a;
        local_48 = local_50;
        local_40 = 4;
        std::allocator<psy::C::SyntaxKind>::allocator(&local_51);
        __l._M_len = local_40;
        __l._M_array = local_48;
        std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
                  (&local_38,__l,&local_51);
        DiagnosticsReporter::ExpectedTokenWithin(&this->diagReporter_,&local_38);
        std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_38);
        std::allocator<psy::C::SyntaxKind>::~allocator(&local_51);
        return false;
      }
      goto LAB_004077b1;
    }
  }
  pEVar6 = makeNode<psy::C::ExtGNU_AttributeSyntax>(this);
  *local_20 = pEVar6;
  IVar5 = consume(this);
  (*local_20)->kwOrIdentTkIdx_ = IVar5;
  pSVar4 = peek(this,1);
  SVar1 = SyntaxToken::kind(pSVar4);
  if (SVar1 != OpenParenToken) {
    return true;
  }
  IVar5 = consume(this);
  (*local_20)->openParenTkIdx_ = IVar5;
  pSVar4 = SyntaxTree::tokenAt(this->tree_,(*local_20)->kwOrIdentTkIdx_);
  if ((pSVar4->field_10).lexeme_ != (Lexeme *)0x0) {
    __s1 = TextElement::c_str(&((pSVar4->field_10).lexeme_)->super_TextElement);
    iVar2 = strcmp(__s1,"availability");
    if (iVar2 == 0) {
      local_80 = parseExtGNU_AttributeArgumentsLLVM;
      goto LAB_00407934;
    }
  }
  local_80 = parseExtGNU_AttributeArguments;
LAB_00407934:
  uVar3 = (*local_80)(this,&(*local_20)->exprs_);
  local_b9 = false;
  if ((uVar3 & 1) != 0) {
    local_b9 = matchOrSkipTo(this,CloseParenToken,&(*local_20)->closeParenTkIdx_);
  }
  return local_b9;
}

Assistant:

bool Parser::parseExtGNU_Attribute(ExtGNU_AttributeSyntax*& attr)
{
    DBG_THIS_RULE();

    switch (peek().kind()) {
        case SyntaxKind::IdentifierToken:
        case SyntaxKind::Keyword_const:
            attr = makeNode<ExtGNU_AttributeSyntax>();
            attr->kwOrIdentTkIdx_ = consume();
            break;

        case SyntaxKind::CommaToken:
        case SyntaxKind::CloseParenToken:
            // An empty attribute is valid.
            attr = makeNode<ExtGNU_AttributeSyntax>();
            return true;

        default:
            diagReporter_.ExpectedTokenWithin(
                { SyntaxKind::IdentifierToken,
                  SyntaxKind::Keyword_const,
                  SyntaxKind::CommaToken,
                  SyntaxKind::CloseParenToken });
            return false;
    }

    if (peek().kind() != SyntaxKind::OpenParenToken)
        return true;

    attr->openParenTkIdx_ = consume();

    auto ident = tree_->tokenAt(attr->kwOrIdentTkIdx_).identifier_;
    bool (Parser::*parseAttrArg)(ExpressionListSyntax*&);
    if (ident && !strcmp(ident->c_str(), "availability"))
        parseAttrArg = &Parser::parseExtGNU_AttributeArgumentsLLVM;
    else
        parseAttrArg = &Parser::parseExtGNU_AttributeArguments;

    return ((this->*(parseAttrArg))(attr->exprs_))
        && matchOrSkipTo(SyntaxKind::CloseParenToken, &attr->closeParenTkIdx_);
}